

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  undefined2 uVar1;
  uint uVar2;
  code *pcVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  boolean bVar7;
  long lVar8;
  void *__s;
  long in_RSI;
  long in_RDI;
  forward_DCT_ptr forward_DCT;
  JBLOCKROW lastblockrow;
  JBLOCKROW thisblockrow;
  JBLOCKARRAY buffer;
  jpeg_component_info *compptr;
  JCOEF lastDC;
  int ndummy;
  int block_rows;
  int block_row;
  int h_samp_factor;
  int ci;
  int bi;
  JDIMENSION MCUindex;
  JDIMENSION MCUs_across;
  JDIMENSION blocks_across;
  JDIMENSION last_iMCU_row;
  my_coef_ptr coef;
  long local_68;
  void *local_60;
  long local_50;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_30;
  int local_2c;
  uint local_28;
  uint in_stack_ffffffffffffffe0;
  j_compress_ptr cinfo_00;
  
  cinfo_00 = *(j_compress_ptr *)(in_RDI + 0x208);
  uVar5 = *(int *)(in_RDI + 0x16c) - 1;
  local_30 = 0;
  local_50 = *(long *)(in_RDI + 0x68);
  for (; local_30 < *(int *)(in_RDI + 0x5c); local_30 = local_30 + 1) {
    lVar8 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                      (in_RDI,cinfo_00->quant_tbl_ptrs[local_30],
                       *(int *)&cinfo_00->progress * *(int *)(local_50 + 0xc),
                       *(undefined4 *)(local_50 + 0xc),1);
    if (*(uint *)&cinfo_00->progress < uVar5) {
      local_3c = *(uint *)(local_50 + 0xc);
    }
    else {
      local_3c = *(uint *)(local_50 + 0x20) % *(uint *)(local_50 + 0xc);
      if (local_3c == 0) {
        local_3c = *(uint *)(local_50 + 0xc);
      }
    }
    in_stack_ffffffffffffffe0 = *(uint *)(local_50 + 0x1c);
    uVar2 = *(uint *)(local_50 + 8);
    local_40 = in_stack_ffffffffffffffe0 % uVar2;
    if (0 < (int)local_40) {
      local_40 = uVar2 - local_40;
    }
    pcVar3 = *(code **)(*(long *)(in_RDI + 0x228) + 8 + (long)local_30 * 8);
    for (local_38 = 0; (int)local_38 < (int)local_3c; local_38 = local_38 + 1) {
      lVar4 = *(long *)(lVar8 + (long)(int)local_38 * 8);
      (*pcVar3)(in_RDI,local_50,*(undefined8 *)(in_RSI + (long)local_30 * 8),lVar4,
                local_38 * *(int *)(local_50 + 0x28),0,in_stack_ffffffffffffffe0);
      if (0 < (int)local_40) {
        __s = (void *)(lVar4 + (ulong)in_stack_ffffffffffffffe0 * 0x80);
        memset(__s,0,(long)(int)local_40 << 7);
        uVar1 = *(undefined2 *)((long)__s + -0x80);
        for (local_2c = 0; local_2c < (int)local_40; local_2c = local_2c + 1) {
          *(undefined2 *)((long)__s + (long)local_2c * 0x80) = uVar1;
        }
      }
    }
    if (*(uint *)&cinfo_00->progress == uVar5) {
      in_stack_ffffffffffffffe0 = local_40 + in_stack_ffffffffffffffe0;
      uVar6 = in_stack_ffffffffffffffe0 / uVar2;
      for (local_38 = local_3c; (int)local_38 < *(int *)(local_50 + 0xc); local_38 = local_38 + 1) {
        local_60 = *(void **)(lVar8 + (long)(int)local_38 * 8);
        local_68 = *(long *)(lVar8 + (long)(int)(local_38 - 1) * 8);
        memset(local_60,0,(ulong)in_stack_ffffffffffffffe0 << 7);
        for (local_28 = 0; local_28 < uVar6; local_28 = local_28 + 1) {
          uVar1 = *(undefined2 *)(local_68 + (long)(int)(uVar2 - 1) * 0x80);
          for (local_2c = 0; local_2c < (int)uVar2; local_2c = local_2c + 1) {
            *(undefined2 *)((long)local_60 + (long)local_2c * 0x80) = uVar1;
          }
          local_60 = (void *)((long)local_60 + (long)(int)uVar2 * 0x80);
          local_68 = local_68 + (long)(int)uVar2 * 0x80;
        }
      }
    }
    local_50 = local_50 + 0x60;
  }
  bVar7 = compress_output(cinfo_00,(JSAMPIMAGE)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
  return bVar7;
}

Assistant:

METHODDEF(boolean)
compress_first_pass (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;
  forward_DCT_ptr forward_DCT;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int) (blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    forward_DCT = cinfo->fdct->forward_DCT[ci];
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*forward_DCT) (cinfo, compptr, input_buf[ci], thisblockrow,
		      (JDIMENSION) (block_row * compptr->DCT_v_scaled_size),
		      (JDIMENSION) 0, blocks_across);
      if (ndummy > 0) {
	/* Create dummy blocks at the right edge of the image. */
	thisblockrow += blocks_across; /* => first dummy block */
	FMEMZERO((void FAR *) thisblockrow, ndummy * SIZEOF(JBLOCK));
	lastDC = thisblockrow[-1][0];
	for (bi = 0; bi < ndummy; bi++) {
	  thisblockrow[bi][0] = lastDC;
	}
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;	/* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
	   block_row++) {
	thisblockrow = buffer[block_row];
	lastblockrow = buffer[block_row-1];
	FMEMZERO((void FAR *) thisblockrow,
		 (size_t) (blocks_across * SIZEOF(JBLOCK)));
	for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
	  lastDC = lastblockrow[h_samp_factor-1][0];
	  for (bi = 0; bi < h_samp_factor; bi++) {
	    thisblockrow[bi][0] = lastDC;
	  }
	  thisblockrow += h_samp_factor; /* advance to next MCU in row */
	  lastblockrow += h_samp_factor;
	}
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}